

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O3

bool rewriteProgram(AssemblyCommands *commands,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *tempToColorMap,RegisterInfo *registerInfo)

{
  int iVar1;
  
  iVar1 = countSpilled(tempToColorMap);
  if (iVar1 == 0) {
    addFirstLineAllocation(commands,registerInfo);
    colorToRegistersChange(commands,tempToColorMap,registerInfo);
  }
  else {
    processSpilledTemps(commands,tempToColorMap,registerInfo);
  }
  return iVar1 == 0;
}

Assistant:

bool rewriteProgram(AssemblyCommands& commands,
                    std::map<std::string, int>& tempToColorMap,
                    AssemblyCode::RegisterInfo& registerInfo) {

    int newSpilledCount = countSpilled(tempToColorMap);
    if (newSpilledCount == 0) {
        addFirstLineAllocation(commands, registerInfo);
        colorToRegistersChange(commands, tempToColorMap, registerInfo);
        return true;
    } else {
        processSpilledTemps(commands, tempToColorMap, registerInfo);
        return false;
    }
}